

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

void do_error(dmr_C *C,position pos,char *fmt,__va_list_tag *args)

{
  C->die_if_error = 1;
  *(byte *)&C->has_error = (byte)C->has_error | 1;
  C->max_warnings = 0;
  C->show_info = 1;
  if (100 < C->errors) {
    C->show_info = 0;
    if (C->once != 0) {
      return;
    }
    C->once = 1;
    fmt = "too many errors";
  }
  do_warn(C,"error: ",pos,fmt,args);
  C->errors = C->errors + 1;
  return;
}

Assistant:

static void do_error(struct dmr_C *C, struct position pos, const char *fmt,
		     va_list args)
{
	C->die_if_error = 1;
	C->show_info = 1;
	/* Shut up warnings after an error */
	C->has_error |= ERROR_CURR_PHASE;
	C->max_warnings = 0;
	if (C->errors > 100) {
		C->show_info = 0;
		if (C->once)
			return;
		fmt = "too many errors";
		C->once = 1;
	}

	do_warn(C, "error: ", pos, fmt, args);
	C->errors++;
}